

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O2

void Output::Flush(void)

{
  undefined8 *in_FS_OFFSET;
  
  if (*(char *)*in_FS_OFFSET != '\0') {
    return;
  }
  if (s_outputFile.super_BasePtr<_PAL_FILE>.ptr != (_PAL_FILE *)0x0) {
    PAL_fflush((PAL_FILE *)s_outputFile.super_BasePtr<_PAL_FILE>.ptr);
  }
  PAL__flushall();
  return;
}

Assistant:

void Output::Flush()
{
    if (s_capture)
    {
        return;
    }
#ifdef _WIN32
    if (bufferFreeSize != bufferAllocSize)
    {
        DirectPrint(Output::buffer);
        bufferFreeSize = bufferAllocSize;
    }
#endif
    if(s_outputFile != nullptr)
    {
        fflush(s_outputFile);
    }
    _flushall();
}